

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_swap.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>_>
::_orderRows(Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>_>
             *this)

{
  pointer puVar1;
  pointer puVar2;
  reference this_00;
  Index i_1;
  ulong uVar3;
  uint i;
  ulong uVar4;
  
  for (uVar4 = 0;
      uVar3 = (ulong)*(uint *)&this[1].rowToIndex_.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start, uVar4 < uVar3;
      uVar4 = uVar4 + 1) {
    this_00 = std::
              vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>_>_>
              ::at((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>_>_>
                    *)(this + 1),uVar4);
    Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false>>>
    ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false>>>
                *)this_00,&this->rowToIndex_,(Index)uVar4);
  }
  puVar1 = (this->indexToRow_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->rowToIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
    puVar1[uVar4] = (uint)uVar4;
    puVar2[uVar4] = (uint)uVar4;
    uVar3 = (ulong)*(uint *)&this[1].rowToIndex_.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
  }
  this->rowSwapped_ = false;
  return;
}

Assistant:

inline void Base_swap<Master_matrix, Base_matrix>::_orderRows()
{
  for (unsigned int i = 0; i < _matrix()->get_number_of_columns(); i++) {
    _matrix()->matrix_.at(i).reorder(rowToIndex_, i);
  }
  for (Index i = 0; i < _matrix()->get_number_of_columns(); i++) {
    indexToRow_[i] = i;
    rowToIndex_[i] = i;
  }
  rowSwapped_ = false;
}